

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int little2_contentTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char cVar1;
  int iVar2;
  byte *end_00;
  byte bVar3;
  char *pcVar4;
  byte *pbVar5;
  byte *pbVar6;
  ulong uVar7;
  byte bVar8;
  byte *pbVar9;
  long lVar10;
  uint uVar11;
  bool bVar12;
  
  if (ptr == end) {
    return -4;
  }
  uVar7 = (long)end - (long)ptr & 0xfffffffffffffffe;
  end_00 = (byte *)(ptr + uVar7);
  if (uVar7 == 0) {
    end_00 = (byte *)end;
  }
  bVar12 = ((long)end - (long)ptr & 1U) != 0;
  if (!bVar12) {
    end_00 = (byte *)end;
  }
  if (bVar12 && uVar7 == 0) {
    return -1;
  }
  bVar3 = ptr[1];
  if (0xdb < bVar3) {
    if ((3 < bVar3 - 0xdc) && ((bVar3 != 0xff || ((byte)*ptr < 0xfe))))
    goto switchD_004cd211_default;
    goto switchD_004cd211_caseD_0;
  }
  if (bVar3 - 0xd8 < 4) {
switchD_004cd211_caseD_7:
    if ((long)end_00 - (long)ptr < 4) {
      return -2;
    }
    pbVar5 = (byte *)(ptr + 4);
    goto joined_r0x004cd277;
  }
  if (bVar3 != 0) goto switchD_004cd211_default;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 0:
  case 1:
  case 8:
    goto switchD_004cd211_caseD_0;
  case 2:
    pbVar5 = (byte *)(ptr + 2);
    if (pbVar5 == end_00) {
      return -1;
    }
    bVar3 = ptr[3];
    if (0xdb < bVar3) {
      if (bVar3 - 0xdc < 4) goto switchD_004cd48d_caseD_8;
      if (bVar3 != 0xff) goto LAB_004cd4b8;
      bVar8 = *pbVar5;
      if (0xfd < bVar8) goto switchD_004cd48d_caseD_8;
LAB_004cd4bb:
      if ((*(uint *)((long)namingBitmap +
                    (ulong)(bVar8 >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar3] << 5)) >>
           (bVar8 & 0x1f) & 1) != 0) {
switchD_004cd48d_caseD_16:
        ptr = ptr + 4;
        if ((byte *)ptr == end_00) {
          return -1;
        }
        bVar12 = false;
        do {
          bVar3 = ((byte *)ptr)[1];
          if (0xdb < bVar3) {
            if (bVar3 == 0xff) {
              bVar8 = *ptr;
              if (0xfd < bVar8) goto switchD_004cd211_caseD_0;
            }
            else {
              if (bVar3 - 0xdc < 4) goto switchD_004cd211_caseD_0;
LAB_004cd60b:
              bVar8 = *ptr;
            }
switchD_004cd55e_caseD_1d:
            lVar10 = 2;
            if ((*(uint *)((long)namingBitmap +
                          (ulong)(bVar8 >> 3 & 0x1c |
                                 (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar3] << 5)) >>
                 (bVar8 & 0x1f) & 1) != 0) goto switchD_004cd55e_caseD_16;
            goto switchD_004cd211_caseD_0;
          }
          if (bVar3 != 0) {
            if (3 < bVar3 - 0xd8) goto LAB_004cd60b;
switchD_004cd55e_caseD_7:
            if ((long)end_00 - (long)ptr < 4) {
              return -2;
            }
            goto switchD_004cd211_caseD_0;
          }
          bVar8 = *ptr;
          lVar10 = 2;
          switch(*(undefined1 *)((long)enc[1].scanners + (ulong)bVar8)) {
          case 5:
            if ((long)end_00 - (long)ptr < 2) {
              return -2;
            }
            goto switchD_004cd211_caseD_0;
          case 6:
            if ((long)end_00 - (long)ptr < 3) {
              return -2;
            }
            goto switchD_004cd211_caseD_0;
          case 7:
            goto switchD_004cd55e_caseD_7;
          default:
            goto switchD_004cd211_caseD_0;
          case 9:
          case 10:
          case 0x15:
            pbVar5 = (byte *)ptr + 2;
            if (pbVar5 == end_00) {
              return -1;
            }
            lVar10 = (long)end_00 - (long)ptr;
            goto LAB_004cd813;
          case 0xb:
            goto switchD_004cd83b_caseD_b;
          case 0x11:
            pbVar5 = (byte *)ptr;
            goto switchD_004cd83b_caseD_11;
          case 0x17:
            if (bVar12) goto switchD_004cd211_caseD_0;
            pbVar5 = (byte *)ptr + 2;
            if (pbVar5 == end_00) {
              return -1;
            }
            bVar3 = ((byte *)ptr)[3];
            if (bVar3 < 0xdc) {
              if (bVar3 == 0) {
                uVar11 = (uint)*pbVar5;
                bVar8 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar5);
                if (0x15 < bVar8) {
                  bVar12 = true;
                  lVar10 = 4;
                  if ((bVar8 != 0x16) && (bVar8 != 0x18)) {
                    if (bVar8 != 0x1d) goto LAB_004cd9da;
                    goto LAB_004cd689;
                  }
                  goto switchD_004cd55e_caseD_16;
                }
                if (bVar8 == 5) {
                  if ((long)end_00 - (long)pbVar5 < 2) {
                    return -2;
                  }
                  goto LAB_004cd9da;
                }
                if (bVar8 == 6) {
                  if ((long)end_00 - (long)pbVar5 < 3) {
                    return -2;
                  }
                  goto LAB_004cd9da;
                }
                if (bVar8 != 7) goto LAB_004cd9da;
              }
              else if (3 < bVar3 - 0xd8) goto LAB_004cd686;
              if ((long)end_00 - (long)pbVar5 < 4) {
                return -2;
              }
LAB_004cd9da:
              *nextTokPtr = (char *)pbVar5;
              return 0;
            }
            if (bVar3 == 0xff) {
              uVar11 = (uint)*pbVar5;
              if (0xfd < *pbVar5) goto LAB_004cd9da;
            }
            else {
              if (bVar3 - 0xdc < 4) goto LAB_004cd9da;
LAB_004cd686:
              uVar11 = (uint)*pbVar5;
            }
LAB_004cd689:
            if ((*(uint *)((long)namingBitmap +
                          (ulong)(uVar11 >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar3] << 5)
                          ) >> (uVar11 & 0x1f) & 1) == 0) goto LAB_004cd9da;
            bVar12 = true;
            lVar10 = 4;
          case 0x16:
          case 0x18:
          case 0x19:
          case 0x1a:
          case 0x1b:
switchD_004cd55e_caseD_16:
            ptr = (char *)((byte *)ptr + lVar10);
            if ((byte *)ptr == end_00) {
              return -1;
            }
            break;
          case 0x1d:
            goto switchD_004cd55e_caseD_1d;
          }
        } while( true );
      }
      goto switchD_004cd48d_caseD_8;
    }
    if (bVar3 - 0xd8 < 4) {
switchD_004cd48d_caseD_7:
      if ((long)end_00 - (long)pbVar5 < 4) {
        return -2;
      }
      goto switchD_004cd48d_caseD_8;
    }
    if (bVar3 != 0) {
LAB_004cd4b8:
      bVar8 = *pbVar5;
      goto LAB_004cd4bb;
    }
    bVar8 = *pbVar5;
    cVar1 = *(char *)((long)enc[1].scanners + (ulong)bVar8);
    switch(cVar1) {
    case '\x05':
      if ((long)end_00 - (long)pbVar5 < 2) {
        return -2;
      }
      break;
    case '\x06':
      if ((long)end_00 - (long)pbVar5 < 3) {
        return -2;
      }
      break;
    case '\a':
      goto switchD_004cd48d_caseD_7;
    case '\b':
    case '\t':
    case '\n':
    case '\v':
    case '\f':
    case '\r':
    case '\x0e':
    case '\x12':
    case '\x13':
    case '\x14':
    case '\x15':
    case '\x17':
      break;
    case '\x0f':
      iVar2 = little2_scanPi(enc,ptr + 4,(char *)end_00,nextTokPtr);
      return iVar2;
    case '\x10':
      pbVar5 = (byte *)(ptr + 4);
      if (pbVar5 == end_00) {
        return -1;
      }
      if (ptr[5] == '\0') {
        cVar1 = *(char *)((long)enc[1].scanners + (ulong)*pbVar5);
        if (cVar1 == '\x14') {
          pcVar4 = ptr + 6;
          if ((long)end_00 - (long)pcVar4 < 0xc) {
            return -1;
          }
          iVar2 = 0;
          lVar10 = 0;
          do {
            if ((pcVar4[1] != '\0') || (*pcVar4 != (&big2_scanCdataSection_CDATA_LSQB)[lVar10]))
            goto LAB_004cdb20;
            lVar10 = lVar10 + 1;
            pcVar4 = pcVar4 + 2;
          } while (lVar10 != 6);
          iVar2 = 8;
          pcVar4 = ptr + 0x12;
LAB_004cdb20:
          *nextTokPtr = pcVar4;
          return iVar2;
        }
        if (cVar1 == '\x1b') {
          iVar2 = little2_scanComment(enc,ptr + 6,(char *)end_00,nextTokPtr);
          return iVar2;
        }
      }
      break;
    case '\x11':
      pbVar5 = (byte *)(ptr + 4);
      if (pbVar5 == end_00) {
        return -1;
      }
      bVar3 = ptr[5];
      iVar2 = 0;
      if (bVar3 < 0xdc) {
        if (bVar3 - 0xd8 < 4) {
LAB_004cd72e:
          iVar2 = 0;
          if ((long)end_00 - (long)pbVar5 < 4) {
            return -2;
          }
          goto switchD_004cdb7a_caseD_8;
        }
        if (bVar3 != 0) {
LAB_004cd9e2:
          uVar11 = (uint)*pbVar5;
          goto LAB_004cd9e5;
        }
        uVar11 = (uint)*pbVar5;
        bVar8 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar5);
        if (bVar8 < 0x16) {
          if (bVar8 == 5) {
            if ((long)end_00 - (long)pbVar5 < 2) {
              return -2;
            }
            goto switchD_004cdb7a_caseD_8;
          }
          if (bVar8 == 6) {
            if ((long)end_00 - (long)pbVar5 < 3) {
              return -2;
            }
            goto switchD_004cdb7a_caseD_8;
          }
          if (bVar8 != 7) goto switchD_004cdb7a_caseD_8;
          goto LAB_004cd72e;
        }
        if ((bVar8 != 0x16) && (bVar8 != 0x18)) {
          if (bVar8 != 0x1d) goto switchD_004cdb7a_caseD_8;
          goto LAB_004cd9e5;
        }
      }
      else {
        if (bVar3 - 0xdc < 4) goto switchD_004cdb7a_caseD_8;
        if (bVar3 != 0xff) goto LAB_004cd9e2;
        uVar11 = (uint)*pbVar5;
        if (0xfd < *pbVar5) goto switchD_004cdb7a_caseD_8;
LAB_004cd9e5:
        if ((*(uint *)((long)namingBitmap +
                      (ulong)(uVar11 >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar3] << 5)) >>
             (uVar11 & 0x1f) & 1) == 0) goto switchD_004cdb7a_caseD_8;
      }
      pbVar5 = (byte *)(ptr + 6);
      if (pbVar5 == end_00) {
        return -1;
      }
      pbVar9 = end_00 + (-6 - (long)ptr);
      while( true ) {
        bVar3 = pbVar5[1];
        if (bVar3 < 0xdc) break;
        if (bVar3 == 0xff) {
          uVar11 = (uint)*pbVar5;
          if (0xfd < *pbVar5) goto switchD_004cdb7a_caseD_8;
        }
        else {
          if (bVar3 - 0xdc < 4) goto switchD_004cdb7a_caseD_8;
LAB_004cdaa9:
          uVar11 = (uint)*pbVar5;
        }
LAB_004cdaac:
        if ((*(uint *)((long)namingBitmap +
                      (ulong)(uVar11 >> 3 & 0x1c | (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar3] << 5)
                      ) >> (uVar11 & 0x1f) & 1) == 0) goto switchD_004cdb7a_caseD_8;
LAB_004cdad3:
        pbVar5 = pbVar5 + 2;
        pbVar9 = pbVar9 + -2;
        if (pbVar5 == end_00) {
          return -1;
        }
      }
      if (bVar3 == 0) {
        uVar11 = (uint)*pbVar5;
        bVar8 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar5);
        if (bVar8 - 0x16 < 6) goto LAB_004cdad3;
        if (bVar8 == 0x1d) goto LAB_004cdaac;
        pbVar6 = pbVar5;
        switch(bVar8) {
        case 5:
          if ((long)pbVar9 < 2) {
            return -2;
          }
          break;
        case 6:
          if ((long)pbVar9 < 3) {
            return -2;
          }
          break;
        case 7:
          goto switchD_004cdb7a_caseD_7;
        case 9:
        case 10:
        case 0x15:
          do {
            pbVar5 = pbVar6 + 2;
            if (pbVar5 == end_00) {
              return -1;
            }
            if (pbVar6[3] != 0) goto switchD_004cdb7a_caseD_8;
            bVar3 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar5);
            pbVar6 = pbVar5;
          } while ((bVar3 - 9 < 2) || (bVar3 == 0x15));
          if (bVar3 != 0xb) break;
        case 0xb:
          pbVar5 = pbVar5 + 2;
          iVar2 = 5;
        }
      }
      else {
        if (3 < bVar3 - 0xd8) goto LAB_004cdaa9;
switchD_004cdb7a_caseD_7:
        if ((long)pbVar9 < 4) {
          return -2;
        }
      }
switchD_004cdb7a_caseD_8:
      *nextTokPtr = (char *)pbVar5;
      return iVar2;
    case '\x16':
    case '\x18':
      goto switchD_004cd48d_caseD_16;
    default:
      if (cVar1 != '\x1d') break;
      goto LAB_004cd4bb;
    }
switchD_004cd48d_caseD_8:
    *nextTokPtr = (char *)pbVar5;
    return 0;
  case 3:
    iVar2 = little2_scanRef(enc,ptr + 2,(char *)end_00,nextTokPtr);
    return iVar2;
  case 4:
    pbVar5 = (byte *)(ptr + 2);
    if (pbVar5 == end_00) {
      return -5;
    }
    if (ptr[3] != '\0') goto joined_r0x004cd277;
    if (*pbVar5 != 0x5d) goto joined_r0x004cd277;
    pbVar9 = (byte *)(ptr + 4);
    if (pbVar9 == end_00) {
      return -5;
    }
    if (ptr[5] != '\0') goto joined_r0x004cd277;
    bVar3 = *pbVar9;
    do {
      if (bVar3 == 0x3e) {
        *nextTokPtr = (char *)pbVar9;
        return 0;
      }
joined_r0x004cd277:
      while( true ) {
        pbVar6 = pbVar5;
        if (pbVar6 == end_00) {
          *nextTokPtr = (char *)pbVar6;
          return 6;
        }
        bVar3 = pbVar6[1];
        if (0xdb < bVar3) {
          if (bVar3 == 0xff) {
            if (0xfd < *pbVar6) goto switchD_004cd2e4_caseD_0;
          }
          else if (bVar3 - 0xdc < 4) goto switchD_004cd2e4_caseD_0;
          goto switchD_004cd2e4_default;
        }
        if (3 < bVar3 - 0xd8) break;
switchD_004cd2e4_caseD_7:
        if ((long)end_00 - (long)pbVar6 < 4) goto switchD_004cd2e4_caseD_0;
        pbVar5 = pbVar6 + 4;
      }
      if (bVar3 != 0) goto switchD_004cd2e4_default;
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar6)) {
      case 0:
      case 1:
      case 2:
      case 3:
      case 8:
      case 9:
      case 10:
        goto switchD_004cd2e4_caseD_0;
      case 4:
        pbVar5 = pbVar6 + 2;
        if (pbVar5 == end_00) goto switchD_004cd2e4_caseD_0;
        if ((pbVar6[3] != 0) || (*pbVar5 != 0x5d)) goto joined_r0x004cd277;
        pbVar9 = pbVar6 + 4;
        if (pbVar9 == end_00) goto switchD_004cd2e4_caseD_0;
        if (pbVar6[5] != 0) goto joined_r0x004cd277;
        bVar3 = *pbVar9;
        break;
      case 5:
        if ((long)end_00 - (long)pbVar6 < 2) goto switchD_004cd2e4_caseD_0;
      default:
switchD_004cd2e4_default:
        pbVar5 = pbVar6 + 2;
        goto joined_r0x004cd277;
      case 6:
        if ((long)end_00 - (long)pbVar6 < 3) {
switchD_004cd2e4_caseD_0:
          *nextTokPtr = (char *)pbVar6;
          return 6;
        }
        pbVar5 = pbVar6 + 3;
        goto joined_r0x004cd277;
      case 7:
        goto switchD_004cd2e4_caseD_7;
      }
    } while( true );
  case 5:
    if ((long)end_00 - (long)ptr < 2) {
      return -2;
    }
  default:
switchD_004cd211_default:
    pbVar5 = (byte *)(ptr + 2);
    goto joined_r0x004cd277;
  case 6:
    if ((long)end_00 - (long)ptr < 3) {
      return -2;
    }
    pbVar5 = (byte *)(ptr + 3);
    goto joined_r0x004cd277;
  case 7:
    goto switchD_004cd211_caseD_7;
  case 9:
    pbVar5 = (byte *)(ptr + 2);
    if (pbVar5 == end_00) {
      return -3;
    }
    if ((ptr[3] == '\0') && (*(char *)((long)enc[1].scanners + (ulong)(byte)ptr[2]) == '\n')) {
      pbVar5 = (byte *)(ptr + 4);
    }
    *nextTokPtr = (char *)pbVar5;
    break;
  case 10:
    *nextTokPtr = ptr + 2;
  }
  return 7;
LAB_004cd813:
  lVar10 = lVar10 + -2;
  bVar3 = pbVar5[1];
  uVar7 = (ulong)bVar3;
  if (bVar3 == 0) {
    bVar3 = *pbVar5;
    ptr = (char *)pbVar5;
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)bVar3)) {
    case 5:
      if (lVar10 < 2) {
        return -2;
      }
      goto switchD_004cd48d_caseD_8;
    case 6:
      if (lVar10 < 3) {
        return -2;
      }
      goto switchD_004cd48d_caseD_8;
    case 7:
      goto switchD_004cd83b_caseD_7;
    default:
      goto switchD_004cd48d_caseD_8;
    case 9:
    case 10:
    case 0x15:
      pbVar5 = pbVar5 + 2;
      if (pbVar5 == end_00) {
        return -1;
      }
      goto LAB_004cd813;
    case 0xb:
      goto switchD_004cd83b_caseD_b;
    case 0x11:
      goto switchD_004cd83b_caseD_11;
    case 0x16:
    case 0x18:
      goto switchD_004cd83b_caseD_16;
    case 0x1d:
      uVar7 = 0;
    }
  }
  else {
    if (bVar3 - 0xd8 < 4) {
switchD_004cd83b_caseD_7:
      if (lVar10 < 4) {
        return -2;
      }
      goto switchD_004cd48d_caseD_8;
    }
    if (bVar3 - 0xdc < 4) goto switchD_004cd48d_caseD_8;
    if (bVar3 != 0xff) {
      bVar3 = *pbVar5;
      goto LAB_004cdc06;
    }
    bVar3 = *pbVar5;
    uVar7 = 0xff;
    if (0xfd < bVar3) goto switchD_004cd48d_caseD_8;
  }
LAB_004cdc06:
  if ((*(uint *)((long)namingBitmap +
                (ulong)(bVar3 >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[uVar7] << 5)) >>
       (bVar3 & 0x1f) & 1) != 0) {
switchD_004cd83b_caseD_16:
    iVar2 = little2_scanAtts(enc,(char *)(pbVar5 + 2),(char *)end_00,nextTokPtr);
    return iVar2;
  }
  goto switchD_004cd48d_caseD_8;
switchD_004cd83b_caseD_b:
  *nextTokPtr = (char *)((byte *)ptr + 2);
  return 2;
switchD_004cd83b_caseD_11:
  ptr = (char *)(pbVar5 + 2);
  if ((byte *)ptr == end_00) {
    return -1;
  }
  if ((pbVar5[3] == 0) && (*ptr == 0x3e)) {
    *nextTokPtr = (char *)(pbVar5 + 4);
    return 4;
  }
switchD_004cd211_caseD_0:
  *nextTokPtr = ptr;
  return 0;
}

Assistant:

static
int PREFIX(contentTok)(const ENCODING *enc, const char *ptr, const char *end,
                       const char **nextTokPtr)
{
  if (ptr == end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_LT:
    return PREFIX(scanLt)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_AMP:
    return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_CR:
    ptr += MINBPC(enc);
    if (ptr == end)
      return XML_TOK_TRAILING_CR;
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (ptr == end)
      return XML_TOK_TRAILING_RSQB;
    if (!CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    if (ptr == end)
      return XML_TOK_TRAILING_RSQB;
    if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) { \
        *nextTokPtr = ptr; \
        return XML_TOK_DATA_CHARS; \
      } \
      ptr += n; \
      break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_RSQB:
      if (ptr + MINBPC(enc) != end) {
         if (!CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_RSQB)) {
           ptr += MINBPC(enc);
           break;
         }
         if (ptr + 2*MINBPC(enc) != end) {
           if (!CHAR_MATCHES(enc, ptr + 2*MINBPC(enc), ASCII_GT)) {
             ptr += MINBPC(enc);
             break;
           }
           *nextTokPtr = ptr + 2*MINBPC(enc);
           return XML_TOK_INVALID;
         }
      }
      /* fall through */
    case BT_AMP:
    case BT_LT:
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}